

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

void invokeCallbacksPRE(poptContext con,poptOption *opt)

{
  poptOption *opt_00;
  uint uVar1;
  
  if (opt != (poptOption *)0x0) {
    for (; ((opt->longName != (char *)0x0 || (opt->shortName != '\0')) || (opt->arg != (void *)0x0))
        ; opt = opt + 1) {
      opt_00 = (poptOption *)opt->arg;
      if (opt_00 != (poptOption *)0x0) {
        uVar1 = _poptArgMask & opt->argInfo;
        if (uVar1 == 5) {
          if ((int)opt->argInfo < 0) {
            (*(code *)opt_00)(con,0,0,0,opt->descrip);
          }
        }
        else if (uVar1 == 4) {
          if (opt_00 == poptHelpOptions) {
            opt_00 = poptHelpOptionsI18N;
          }
          invokeCallbacksPRE(con,opt_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void invokeCallbacksPRE(poptContext con, const struct poptOption * opt)
{
    if (opt != NULL)
    for (; opt->longName || opt->shortName || opt->arg; opt++) {
	poptArg arg = { .ptr = opt->arg };
	if (arg.ptr)
	switch (poptArgType(opt)) {
	case POPT_ARG_INCLUDE_TABLE:	/* Recurse on included sub-tables. */
	    poptSubstituteHelpI18N(arg.opt);	/* XXX side effects */
	    invokeCallbacksPRE(con, arg.opt);
	    break;
	case POPT_ARG_CALLBACK:		/* Perform callback. */
	    if (!CBF_ISSET(opt, PRE))
		break;
	    arg.cb(con, POPT_CALLBACK_REASON_PRE, NULL, NULL, opt->descrip);
	    break;
	}
    }
}